

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1afm.c
# Opt level: O3

FT_Int t1_get_index(char *name,FT_Offset len,void *user_data)

{
  int iVar1;
  long lVar2;
  char *__s;
  int iVar3;
  size_t sVar4;
  long lVar5;
  
  lVar5 = 0;
  if ((len < 0x10000) && (iVar1 = *(int *)((long)user_data + 0x188), 0 < (long)iVar1)) {
    lVar2 = *(long *)((long)user_data + 400);
    lVar5 = 0;
    do {
      __s = *(char **)(lVar2 + lVar5 * 8);
      if ((__s != (char *)0x0) && (*__s == *name)) {
        sVar4 = strlen(__s);
        if (sVar4 == len) {
          iVar3 = strncmp(__s,name,len);
          if (iVar3 == 0) goto LAB_00177437;
        }
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
    lVar5 = 0;
  }
LAB_00177437:
  return (FT_Int)lVar5;
}

Assistant:

static FT_Int
  t1_get_index( const char*  name,
                FT_Offset    len,
                void*        user_data )
  {
    T1_Font  type1 = (T1_Font)user_data;
    FT_Int   n;


    /* PS string/name length must be < 16-bit */
    if ( len > 0xFFFFU )
      return 0;

    for ( n = 0; n < type1->num_glyphs; n++ )
    {
      char*  gname = (char*)type1->glyph_names[n];


      if ( gname && gname[0] == name[0]        &&
           ft_strlen( gname ) == len           &&
           ft_strncmp( gname, name, len ) == 0 )
        return n;
    }

    return 0;
  }